

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

string * GetQtMajorVersion_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  char *local_90;
  char *targetQtVersion;
  string local_80;
  allocator local_5d [20];
  allocator local_49;
  string local_48;
  undefined1 local_21;
  cmMakefile *local_20;
  cmMakefile *makefile;
  cmGeneratorTarget *target_local;
  string *qtMajorVersion;
  
  makefile = (cmMakefile *)target;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  pcVar1 = cmTarget::GetMakefile(target->Target);
  local_21 = 0;
  local_20 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"QT_VERSION_MAJOR",&local_49);
  pcVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,local_5d);
  std::allocator<char>::~allocator((allocator<char> *)local_5d);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar3 = std::__cxx11::string::empty();
  pcVar1 = local_20;
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_80,"Qt5Core_VERSION_MAJOR",(allocator *)((long)&targetQtVersion + 7)
              );
    pcVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_80);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar2);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&targetQtVersion + 7));
  }
  pcVar1 = makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"QT_MAJOR_VERSION",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"",&local_d9);
  pcVar2 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                     ((cmGeneratorTarget *)pcVar1,&local_b0,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  if (pcVar2 != (char *)0x0) {
    local_90 = pcVar2;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetQtMajorVersion(cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();
  std::string qtMajorVersion = makefile->GetSafeDefinition("QT_VERSION_MAJOR");
  if (qtMajorVersion.empty()) {
    qtMajorVersion = makefile->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
  }
  const char* targetQtVersion =
    target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION", "");
  if (targetQtVersion != CM_NULLPTR) {
    qtMajorVersion = targetQtVersion;
  }
  return qtMajorVersion;
}